

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equalsi<char32_t,char16_t>
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> lhs,
               basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char16_t *pcVar4;
  wchar32 *pwVar5;
  long lVar6;
  wchar32 wVar7;
  size_t sVar8;
  size_t sVar9;
  
  pwVar5 = lhs._M_str;
  sVar8 = lhs._M_len;
  pcVar4 = rhs._M_str;
  sVar9 = rhs._M_len;
  do {
    if ((sVar8 == 0) || (sVar9 == 0)) {
      return sVar8 == 0 && sVar9 == 0;
    }
    wVar7 = (wchar32)(ushort)*pcVar4;
    lVar6 = 1;
    if (((sVar9 != 1) && ((wVar7 & 0xfc00U) == 0xd800)) && (((ushort)pcVar4[1] & 0xfc00) == 0xdc00))
    {
      wVar7 = (uint)(ushort)*pcVar4 * 0x400 + (uint)(ushort)pcVar4[1] + L'\xfca02400';
      lVar6 = 2;
    }
    if (*pwVar5 == wVar7) {
LAB_0023a473:
      pwVar5 = pwVar5 + 1;
      sVar8 = sVar8 - 1;
      pcVar4 = pcVar4 + lVar6;
      sVar9 = sVar9 - lVar6;
      bVar1 = true;
    }
    else {
      iVar2 = jessilib::fold(*pwVar5);
      iVar3 = jessilib::fold(wVar7);
      if (iVar2 == iVar3) goto LAB_0023a473;
      bVar1 = false;
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}